

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O1

LLVMTypeRef CompileLlvmType(LlvmCompilationContext *ctx,TypeBase *type)

{
  uint uVar1;
  LLVMTypeRefOpaque **ppLVar2;
  LLVMTypeRef pLVar3;
  char *__src;
  int iVar4;
  TypeBase *pTVar5;
  ExpressionContext *pEVar6;
  undefined4 extraout_var;
  ulong uVar7;
  long lVar8;
  SmallArray<LLVMTypeRefOpaque_*,_32U> members;
  LLVMTypeRef local_150;
  SmallArray<LLVMTypeRefOpaque_*,_32U> local_148;
  
  uVar1 = type->typeIndex;
  if ((ctx->types).count <= uVar1) goto LAB_0018452d;
  ppLVar2 = (ctx->types).data;
  pLVar3 = ppLVar2[uVar1];
  if (pLVar3 != (LLVMTypeRef)0x0) {
    return pLVar3;
  }
  if (type == (TypeBase *)0x0) {
LAB_00184340:
    pTVar5 = (TypeBase *)0x0;
LAB_00184342:
    if (pTVar5 == (TypeBase *)0x0) {
      if ((type == (TypeBase *)0x0) || (pTVar5 = type, type->typeID != 0x13)) {
        pTVar5 = (TypeBase *)0x0;
      }
      if (pTVar5 == (TypeBase *)0x0) {
        if ((type == (TypeBase *)0x0) || (pTVar5 = type, type->typeID != 0x14)) {
          pTVar5 = (TypeBase *)0x0;
        }
        if (pTVar5 == (TypeBase *)0x0) {
          if (type == (TypeBase *)0x0) {
LAB_00184421:
            pTVar5 = (TypeBase *)0x0;
          }
          else {
            if (type->typeID == 0x15) {
              CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
              pTVar5 = ctx->ctx->typeNullPtr;
              goto LAB_001843bf;
            }
            if ((type == (TypeBase *)0x0) || (pTVar5 = type, type->typeID != 0x18))
            goto LAB_00184421;
          }
          if (pTVar5 == (TypeBase *)0x0) {
            if ((type == (TypeBase *)0x0) || (type->typeID != 0x19)) {
              __assert_fail("!\"unknown type\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                            ,0x1ba,
                            "LLVMTypeRef CompileLlvmType(LlvmCompilationContext &, TypeBase *)");
            }
            goto LAB_001844ff;
          }
          __src = (pTVar5->name).begin;
          uVar7 = (long)(pTVar5->name).end - (long)__src;
          iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)((int)uVar7 + 1));
          uVar7 = uVar7 & 0xffffffff;
          memcpy((void *)CONCAT44(extraout_var,iVar4),__src,uVar7);
          *(undefined1 *)((long)CONCAT44(extraout_var,iVar4) + uVar7) = 0;
          if ((ctx->types).count <= type->typeIndex) goto LAB_0018452d;
          (ctx->types).data[type->typeIndex] = (LLVMTypeRefOpaque *)&placeholderType;
          local_148.allocator = ctx->allocator;
          local_148.data = local_148.little;
          local_148.count = 0;
          local_148.max = 0x20;
          lVar8._0_4_ = pTVar5[1].typeID;
          lVar8._4_4_ = pTVar5[1].nameHash;
          if (lVar8 != 0) {
            do {
              local_150 = CompileLlvmType(ctx,*(TypeBase **)(*(long *)(lVar8 + 8) + 0x20));
              SmallArray<LLVMTypeRefOpaque_*,_32U>::push_back(&local_148,&local_150);
              lVar8 = *(long *)(lVar8 + 0x18);
            } while (lVar8 != 0);
          }
          if ((ctx->types).count <= type->typeIndex) goto LAB_0018452d;
          SmallArray<LLVMTypeRefOpaque_*,_32U>::~SmallArray(&local_148);
          goto LAB_0018450a;
        }
        pTVar5 = *(TypeBase **)&pTVar5[1].typeIndex;
        goto LAB_001843bf;
      }
      CompileLlvmType(ctx,(TypeBase *)pTVar5[1]._vptr_TypeBase);
      uVar1 = type->typeIndex;
      if ((ctx->types).count <= uVar1) goto LAB_0018452d;
    }
    else {
      pTVar5 = (TypeBase *)pTVar5[1]._vptr_TypeBase;
      pEVar6 = ctx->ctx;
      if (pTVar5 == pEVar6->typeVoid) goto LAB_00184357;
LAB_001843bf:
      CompileLlvmType(ctx,pTVar5);
      uVar1 = type->typeIndex;
      if ((ctx->types).count <= uVar1) goto LAB_0018452d;
    }
    (ctx->types).data[uVar1] = (LLVMTypeRefOpaque *)&placeholderType;
  }
  else {
    if (type->typeID != 1) {
      if (type == (TypeBase *)0x0) goto LAB_00184340;
      if (type->typeID == 2) goto LAB_001844ff;
      if (type == (TypeBase *)0x0) goto LAB_00184340;
      if (type->typeID == 3) goto LAB_001844ff;
      if (type == (TypeBase *)0x0) goto LAB_00184340;
      if (type->typeID == 4) goto LAB_001844ff;
      if (type == (TypeBase *)0x0) goto LAB_00184340;
      if (type->typeID == 5) goto LAB_001844ff;
      if (type == (TypeBase *)0x0) goto LAB_00184340;
      if (type->typeID == 6) goto LAB_001844ff;
      if (type == (TypeBase *)0x0) goto LAB_00184340;
      if (type->typeID == 7) goto LAB_001844ff;
      if (type == (TypeBase *)0x0) goto LAB_00184340;
      if (type->typeID == 8) goto LAB_001844ff;
      if (type == (TypeBase *)0x0) goto LAB_00184340;
      if (type->typeID == 9) goto LAB_001844ff;
      if (type == (TypeBase *)0x0) goto LAB_00184340;
      if (type->typeID == 10) goto LAB_001844ff;
      if (type == (TypeBase *)0x0) goto LAB_00184340;
      if (type->typeID != 0xb) {
        if (type == (TypeBase *)0x0) goto LAB_00184340;
        if (type->typeID == 0x10) goto LAB_0018432c;
        if (type == (TypeBase *)0x0) goto LAB_00184340;
        if (type->typeID == 0x11) goto LAB_0018432c;
        if ((type == (TypeBase *)0x0) || (pTVar5 = type, type->typeID != 0x12)) goto LAB_00184340;
        goto LAB_00184342;
      }
LAB_0018432c:
      pEVar6 = ctx->ctx;
LAB_00184357:
      pTVar5 = pEVar6->typeChar;
      goto LAB_001843bf;
    }
LAB_001844ff:
    ppLVar2[uVar1] = (LLVMTypeRefOpaque *)&placeholderType;
  }
LAB_0018450a:
  if (type->typeIndex < (ctx->types).count) {
    return (ctx->types).data[type->typeIndex];
  }
LAB_0018452d:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x199,
                "T &SmallArray<LLVMTypeRefOpaque *, 128>::operator[](unsigned int) [T = LLVMTypeRefOpaque *, N = 128]"
               );
}

Assistant:

LLVMTypeRef CompileLlvmType(LlvmCompilationContext &ctx, TypeBase *type)
{
	if(LLVMTypeRef llvmType = ctx.types[type->typeIndex])
		return llvmType;

	if(isType<TypeVoid>(type))
	{
		ctx.types[type->typeIndex] = LLVMVoidTypeInContext(ctx.context);
	}
	else if(isType<TypeBool>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt1TypeInContext(ctx.context);
	}
	else if(isType<TypeChar>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt8TypeInContext(ctx.context);
	}
	else if(isType<TypeShort>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt16TypeInContext(ctx.context);
	}
	else if(isType<TypeInt>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt32TypeInContext(ctx.context);
	}
	else if(isType<TypeLong>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt64TypeInContext(ctx.context);
	}
	else if(isType<TypeFloat>(type))
	{
		ctx.types[type->typeIndex] = LLVMFloatTypeInContext(ctx.context);
	}
	else if(isType<TypeDouble>(type))
	{
		ctx.types[type->typeIndex] = LLVMDoubleTypeInContext(ctx.context);
	}
	else if(isType<TypeTypeID>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt32TypeInContext(ctx.context);
	}
	else if(isType<TypeFunctionID>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt32TypeInContext(ctx.context);
	}
	else if(isType<TypeNullptr>(type))
	{
		ctx.types[type->typeIndex] = LLVMPointerType(CompileLlvmType(ctx, ctx.ctx.typeChar), 0);
	}
	else if(isType<TypeAutoRef>(type))
	{
		LLVMTypeRef members[2] = { LLVMInt32TypeInContext(ctx.context), LLVMPointerType(CompileLlvmType(ctx, ctx.ctx.typeChar), 0) };

		ctx.types[type->typeIndex] = LLVMStructTypeInContext(ctx.context, members, 2, true);
	}
	else if(isType<TypeAutoArray>(type))
	{
		LLVMTypeRef members[3] = { LLVMInt32TypeInContext(ctx.context), LLVMPointerType(CompileLlvmType(ctx, ctx.ctx.typeChar), 0), LLVMInt32TypeInContext(ctx.context) };

		ctx.types[type->typeIndex] = LLVMStructTypeInContext(ctx.context, members, 3, true);
	}
	else if(TypeRef *typeRef = getType<TypeRef>(type))
	{
		ctx.types[type->typeIndex] = LLVMPointerType(CompileLlvmType(ctx, typeRef->subType == ctx.ctx.typeVoid ? ctx.ctx.typeChar : typeRef->subType), 0);
	}
	else if(TypeArray *typeArray = getType<TypeArray>(type))
	{
		if(typeArray->subType == ctx.ctx.typeChar)
			ctx.types[type->typeIndex] = LLVMArrayType(CompileLlvmType(ctx, typeArray->subType), ((unsigned)typeArray->length + 3u) & ~3u);
		else
			ctx.types[type->typeIndex] = LLVMArrayType(CompileLlvmType(ctx, typeArray->subType), (unsigned)typeArray->length);
	}
	else if(TypeUnsizedArray *typeUnsizedArray = getType<TypeUnsizedArray>(type))
	{
		LLVMTypeRef members[2] = { LLVMPointerType(CompileLlvmType(ctx, typeUnsizedArray->subType), 0), LLVMInt32TypeInContext(ctx.context) };

		ctx.types[type->typeIndex] = LLVMStructTypeInContext(ctx.context, members, 2, true);
	}
	else if(isType<TypeFunction>(type))
	{
		// TODO: use function indices and remap before execution
		//LLVMTypeRef members[2] = { LLVMPointerType(CompileLlvmType(ctx, ctx.ctx.typeChar), 0), LLVMInt32TypeInContext(ctx.context) };
		LLVMTypeRef members[2] = { CompileLlvmType(ctx, ctx.ctx.typeNullPtr), CompileLlvmType(ctx, ctx.ctx.typeNullPtr) };

		ctx.types[type->typeIndex] = LLVMStructTypeInContext(ctx.context, members, 2, true);
	}
	else if(TypeClass *typeClass = getType<TypeClass>(type))
	{
		ctx.types[type->typeIndex] = LLVMStructCreateNamed(ctx.context, CreateLlvmName(ctx, typeClass->name));

		SmallArray<LLVMTypeRef, 32> members(ctx.allocator);

		for(MemberHandle *curr = typeClass->members.head; curr; curr = curr->next)
			members.push_back(CompileLlvmType(ctx, curr->variable->type));

		// TODO: create packed type with custom padding
		LLVMStructSetBody(ctx.types[type->typeIndex], members.data, members.count, false);
	}
	else if(isType<TypeEnum>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt32TypeInContext(ctx.context);
	}
	else
	{
		assert(!"unknown type");
	}

	return ctx.types[type->typeIndex];
}